

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_function.h
# Opt level: O2

duk_ret_t dukglue::detail::FuncInfoHolder<void,_Shape_*>::FuncRuntime::call_native_function
                    (duk_context *ctx)

{
  code *pcVar1;
  Shape *pSVar2;
  
  duk_push_current_function(ctx);
  duk_get_prop_string(ctx,-1,anon_var_dwarf_dfc3);
  pcVar1 = (code *)duk_require_pointer(ctx,-1);
  if (pcVar1 != (code *)0x0) {
    duk_pop_2(ctx);
    pSVar2 = types::DukType<Shape>::read<Shape*,void>(ctx,0);
    (*pcVar1)(pSVar2);
    return 0;
  }
  duk_error_raw(ctx,-6,
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_function.h"
                ,0x41,"what even");
}

Assistant:

static duk_ret_t call_native_function(duk_context* ctx)
				{
					duk_push_current_function(ctx);
					duk_get_prop_string(ctx, -1, "\xFF" "func_ptr");
					void* fp_void = duk_require_pointer(ctx, -1);
					if (fp_void == NULL) {
						duk_error(ctx, DUK_RET_TYPE_ERROR, "what even");
						return DUK_RET_TYPE_ERROR;
					}

					duk_pop_2(ctx);

          static_assert(sizeof(RetType(*)(Ts...)) == sizeof(void*), "Function pointer and data pointer are different sizes");
					RetType(*funcToCall)(Ts...) = reinterpret_cast<RetType(*)(Ts...)>(fp_void);

					actually_call(ctx, funcToCall, dukglue::detail::get_stack_values<Ts...>(ctx));
					return std::is_void<RetType>::value ? 0 : 1;
				}